

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int ARKodeGetNumRelaxJacEvals(void *arkode_mem,long *J_evals)

{
  undefined8 *in_RSI;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkRelaxAccessMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              in_stack_ffffffffffffffc8,(ARKodeRelaxMem *)0x16fac9);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8->step_supports_relaxation == 0) {
      arkProcessError(in_stack_ffffffffffffffd8,-0x30,0x2a1,"ARKodeGetNumRelaxJacEvals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
      local_4 = -0x30;
    }
    else {
      *in_RSI = *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x30);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeGetNumRelaxJacEvals(void* arkode_mem, long int* J_evals)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  *J_evals = relax_mem->num_relax_jac_evals;

  return ARK_SUCCESS;
}